

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_transform.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListTransformBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  reference pvVar7;
  pointer pEVar8;
  BoundLambdaExpression *pBVar9;
  BinderException *this_00;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  if (pEVar8[9] == (Expression)0x29) {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    _Var1._M_head_impl =
         (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    duckdb::BoundCastExpression::AddArrayCastToList(&local_68);
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    _Var4._M_head_impl = local_68._M_head_impl;
    local_68._M_head_impl = (Expression *)0x0;
    _Var2._M_head_impl =
         (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
    if (local_68._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
    local_68._M_head_impl = (Expression *)0x0;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)_Var1._M_head_impl + 8))();
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    pBVar9 = BaseExpression::Cast<duckdb::BoundLambdaExpression>((BaseExpression *)pEVar8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               (pBVar9 + 0x58));
    duckdb::LogicalType::LIST((LogicalType *)&local_68);
    uVar6 = uStack_58;
    uVar5 = local_60;
    bound_function->field_0x90 = local_68._M_head_impl._0_1_;
    bound_function->field_0x91 = local_68._M_head_impl._1_1_;
    uVar10 = *(undefined4 *)&bound_function->field_0x98;
    uVar12 = *(undefined4 *)&bound_function->field_0xa0;
    *(undefined8 *)&bound_function->field_0x98 = 0;
    *(undefined8 *)&bound_function->field_0xa0 = 0;
    local_60 = 0;
    uStack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&bound_function->field_0xa0;
    *(undefined8 *)&bound_function->field_0x98 = uVar5;
    *(undefined8 *)&bound_function->field_0xa0 = uVar6;
    uVar11 = *(undefined4 *)&bound_function->field_0x9c;
    uVar13 = *(undefined4 *)&bound_function->field_0xa4;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_48 = uVar10;
      uStack_44 = *(undefined4 *)&bound_function->field_0x9c;
      uStack_40 = uVar12;
      uStack_3c = *(undefined4 *)&bound_function->field_0xa4;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      uVar10 = local_48;
      uVar11 = uStack_44;
      uVar12 = uStack_40;
      uVar13 = uStack_3c;
    }
    p_Var3 = uStack_58;
    local_60 = CONCAT44(uVar11,uVar10);
    uStack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar13,uVar12);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_68);
    LambdaFunctions::ListLambdaBind
              ((LambdaFunctions *)this,context,bound_function,arguments,
               *(long *)(pBVar9 + 0x78) == 2);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  local_68._M_head_impl = (Expression *)&uStack_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Invalid lambda expression!","");
  duckdb::BinderException::BinderException(this_00,(string *)&local_68);
  __cxa_throw(this_00,&BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> ListTransformBind(ClientContext &context, ScalarFunction &bound_function,
                                                  vector<unique_ptr<Expression>> &arguments) {

	// the list column and the bound lambda expression
	D_ASSERT(arguments.size() == 2);
	if (arguments[1]->GetExpressionClass() != ExpressionClass::BOUND_LAMBDA) {
		throw BinderException("Invalid lambda expression!");
	}

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	auto &bound_lambda_expr = arguments[1]->Cast<BoundLambdaExpression>();
	bound_function.return_type = LogicalType::LIST(bound_lambda_expr.lambda_expr->return_type);
	auto has_index = bound_lambda_expr.parameter_count == 2;
	return LambdaFunctions::ListLambdaBind(context, bound_function, arguments, has_index);
}